

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O0

void __thiscall Json::StyledWriter::indent(StyledWriter *this)

{
  int iVar1;
  long in_RDI;
  allocator local_29;
  string local_28 [40];
  
  iVar1 = *(int *)(in_RDI + 100);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_28,(long)iVar1,' ',&local_29);
  std::__cxx11::string::operator+=((string *)(in_RDI + 0x40),local_28);
  std::__cxx11::string::~string(local_28);
  std::allocator<char>::~allocator((allocator<char> *)&local_29);
  return;
}

Assistant:

void StyledWriter::indent() { indentString_ += std::string(indentSize_, ' '); }